

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall
kratos::SwitchStmt::remove_switch_case
          (SwitchStmt *this,shared_ptr<kratos::Const> *switch_case,shared_ptr<kratos::Stmt> *stmt)

{
  element_type *peVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  
  iVar2 = std::
          _Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
          ::find(&(this->body_)._M_t,switch_case);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->body_)._M_t._M_impl.super__Rb_tree_header) {
    pmVar3 = std::
             map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
             ::at(&this->body_,switch_case);
    peVar1 = (pmVar3->super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (*(peVar1->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[10])(peVar1,stmt);
    return;
  }
  return;
}

Assistant:

void SwitchStmt::remove_switch_case(const std::shared_ptr<kratos::Const> &switch_case,
                                    const std::shared_ptr<kratos::Stmt> &stmt) {
    if (body_.find(switch_case) != body_.end()) {
        auto &stmts = body_.at(switch_case);
        stmts->remove_stmt(stmt);
    }
}